

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

void __thiscall despot::Adventurer::PrintTransitions(Adventurer *this)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  State *next;
  int local_18;
  int i;
  int a;
  int s;
  Adventurer *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Transitions (Start)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  i = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0xf8))();
    if (iVar1 <= i) break;
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"State ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,i);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = (**(code **)(*(long *)this + 0x108))(this,i);
    (**(code **)(*(long *)this + 0x88))(this,uVar4,&std::cout);
    local_18 = 0;
    while( true ) {
      iVar1 = (**(code **)(*(long *)this + 0x28))();
      if (iVar1 <= local_18) break;
      pvVar5 = std::
               vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ::operator[](&this->transition_probabilities_,(long)i);
      pvVar6 = std::
               vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
               ::operator[](pvVar5,(long)local_18);
      sVar7 = std::vector<despot::State,_std::allocator<despot::State>_>::size(pvVar6);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,sVar7);
      poVar2 = std::operator<<(poVar2," outcomes for action ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_18);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      next._4_4_ = 0;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ::operator[](&this->transition_probabilities_,(long)i);
        pvVar6 = std::
                 vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                 ::operator[](pvVar5,(long)local_18);
        sVar7 = std::vector<despot::State,_std::allocator<despot::State>_>::size(pvVar6);
        if (sVar7 <= (ulong)(long)next._4_4_) break;
        pvVar5 = std::
                 vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ::operator[](&this->transition_probabilities_,(long)i);
        pvVar6 = std::
                 vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                 ::operator[](pvVar5,(long)local_18);
        pvVar8 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                           (pvVar6,(long)next._4_4_);
        poVar2 = std::operator<<((ostream *)&std::cout,"Next = (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(pvVar8 + 0xc));
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(pvVar8 + 0x18));
        poVar2 = std::operator<<(poVar2,")");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        uVar4 = (**(code **)(*(long *)this + 0x108))(this,*(undefined4 *)(pvVar8 + 0xc));
        (**(code **)(*(long *)this + 0x88))(this,uVar4,&std::cout);
        next._4_4_ = next._4_4_ + 1;
      }
      local_18 = local_18 + 1;
    }
    i = i + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Transitions (End)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Adventurer::PrintTransitions() const {
	cout << "Transitions (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout
			<< "--------------------------------------------------------------------------------"
			<< endl;
		cout << "State " << s << endl;
		PrintState(*GetState(s));
		for (int a = 0; a < NumActions(); a++) {
			cout << transition_probabilities_[s][a].size()
				<< " outcomes for action " << a << endl;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "Next = (" << next.state_id << ", " << next.weight
					<< ")" << endl;
				PrintState(*GetState(next.state_id));
			}
		}
	}
	cout << "Transitions (End)" << endl;
}